

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O3

bool tcu::anon_unknown_3::pixelOnlyOnASharedEdge
               (IVec2 *pixel,SceneTriangle *triangle,IVec2 *viewportSize)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int in_ECX;
  int in_R8D;
  Vector<float,_2> *res_1;
  float fVar5;
  float fVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Vector<float,_2> res;
  Vec2 local_48;
  Vec2 VStack_40;
  Vec2 local_38;
  
  cVar1 = (char)viewportSize[0xc].m_data[0];
  if (((cVar1 != '\0') || (*(char *)((long)viewportSize[0xc].m_data + 1) != '\0')) ||
     (*(char *)((long)viewportSize[0xc].m_data + 2) == '\x01')) {
    auVar8._8_8_ = *(undefined8 *)viewportSize[2].m_data;
    auVar8._0_8_ = *(undefined8 *)viewportSize->m_data;
    auVar6._4_4_ = viewportSize[1].m_data[1];
    auVar6._0_4_ = viewportSize[1].m_data[1];
    auVar6._8_4_ = viewportSize[3].m_data[1];
    auVar6._12_4_ = viewportSize[3].m_data[1];
    auVar9 = divps(auVar8,auVar6);
    fVar5 = (float)in_ECX;
    fVar7 = (float)in_R8D;
    local_48.m_data[0] = (auVar9._0_4_ + 1.0) * 0.5 * fVar5;
    local_48.m_data[1] = (auVar9._4_4_ + 1.0) * 0.5 * fVar7;
    VStack_40.m_data[0] = (auVar9._8_4_ + 1.0) * 0.5 * fVar5;
    VStack_40.m_data[1] = (auVar9._12_4_ + 1.0) * 0.5 * fVar7;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)viewportSize[4].m_data;
    auVar9._4_4_ = viewportSize[5].m_data[1];
    auVar9._0_4_ = viewportSize[5].m_data[1];
    auVar9._8_4_ = viewportSize[6].m_data[0];
    auVar9._12_4_ = viewportSize[6].m_data[0];
    auVar9 = divps(auVar10,auVar9);
    local_38.m_data[0] = (auVar9._0_4_ + 1.0) * 0.5 * fVar5;
    local_38.m_data[1] = (auVar9._4_4_ + 1.0) * 0.5 * fVar7;
    bVar2 = pixelNearLineSegment
                      ((anon_unknown_3 *)((ulong)pixel & 0xffffffff),
                       (IVec2 *)((ulong)triangle & 0xffffffff),&local_48,&VStack_40);
    bVar3 = pixelNearLineSegment
                      ((anon_unknown_3 *)((ulong)pixel & 0xffffffff),
                       (IVec2 *)((ulong)triangle & 0xffffffff),&VStack_40,&local_38);
    bVar4 = pixelNearLineSegment
                      ((anon_unknown_3 *)((ulong)pixel & 0xffffffff),
                       (IVec2 *)((ulong)triangle & 0xffffffff),&local_38,&local_48);
    if ((!bVar3 && !bVar4) && bVar2) {
      return (bool)cVar1;
    }
    if ((!bVar2 && !bVar4) && bVar3) {
      return (bool)*(undefined1 *)((long)viewportSize[0xc].m_data + 1);
    }
    if ((!bVar2 && !bVar3) && bVar4) {
      return (bool)*(undefined1 *)((long)viewportSize[0xc].m_data + 2);
    }
  }
  return false;
}

Assistant:

bool pixelOnlyOnASharedEdge (const tcu::IVec2& pixel, const TriangleSceneSpec::SceneTriangle& triangle, const tcu::IVec2& viewportSize)
{
	if (triangle.sharedEdge[0] || triangle.sharedEdge[1] || triangle.sharedEdge[2])
	{
		const tcu::Vec2 triangleNormalizedDeviceSpace[3] =
		{
			tcu::Vec2(triangle.positions[0].x() / triangle.positions[0].w(), triangle.positions[0].y() / triangle.positions[0].w()),
			tcu::Vec2(triangle.positions[1].x() / triangle.positions[1].w(), triangle.positions[1].y() / triangle.positions[1].w()),
			tcu::Vec2(triangle.positions[2].x() / triangle.positions[2].w(), triangle.positions[2].y() / triangle.positions[2].w()),
		};
		const tcu::Vec2 triangleScreenSpace[3] =
		{
			(triangleNormalizedDeviceSpace[0] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
			(triangleNormalizedDeviceSpace[1] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
			(triangleNormalizedDeviceSpace[2] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
		};

		const bool pixelOnEdge0 = pixelNearLineSegment(pixel, triangleScreenSpace[0], triangleScreenSpace[1]);
		const bool pixelOnEdge1 = pixelNearLineSegment(pixel, triangleScreenSpace[1], triangleScreenSpace[2]);
		const bool pixelOnEdge2 = pixelNearLineSegment(pixel, triangleScreenSpace[2], triangleScreenSpace[0]);

		// If the pixel is on a multiple edges return false

		if (pixelOnEdge0 && !pixelOnEdge1 && !pixelOnEdge2)
			return triangle.sharedEdge[0];
		if (!pixelOnEdge0 && pixelOnEdge1 && !pixelOnEdge2)
			return triangle.sharedEdge[1];
		if (!pixelOnEdge0 && !pixelOnEdge1 && pixelOnEdge2)
			return triangle.sharedEdge[2];
	}

	return false;
}